

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *this_01;
  pointer pbVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  string *psVar6;
  char *__s;
  size_t sVar7;
  pointer pbVar8;
  string tgt;
  string replace;
  string local_118;
  string local_f8;
  cmLocalUnixMakefileGenerator3 *local_d8;
  string local_d0;
  pointer local_b0;
  char *local_a8;
  string local_a0;
  string *local_80;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  local_b0 = (pointer)depends;
  local_80 = target;
  if (target->_M_string_length == 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"No target for WriteMakeRule! called with comment: ","");
    if (comment != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_d0);
    }
    cmSystemTools::Error(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return;
    }
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d8 = this;
    local_58 = commands;
    if (comment != (char *)0x0) {
      strlen(comment);
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,(ulong)comment);
      lVar4 = std::__cxx11::string::find((char)&local_d0,10);
      if (lVar4 != -1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          lVar4 = std::__cxx11::string::find((char)&local_d0,10);
        } while (lVar4 != -1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d0);
      this = local_d8;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_118,(cmLocalGenerator *)this,psVar6,local_80);
    cmSystemTools::ConvertToOutputPath(&local_f8,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_a8 = "";
    if (local_f8._M_string_length == 1) {
      local_a8 = " ";
    }
    if (symbolic) {
      this_00 = (local_d8->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_MAKE_SYMBOLIC_RULE","");
      __s = cmMakefile::GetDefinition(this_00,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (__s != (char *)0x0) {
        local_118._M_dataplus._M_p = local_f8._M_dataplus._M_p;
        poVar5 = operator<<(os,(cmMakeSafe *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_a8,(ulong)(local_f8._M_string_length == 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
    }
    pbVar2 = local_b0;
    if ((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_b0->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start ==
        (pointer)local_b0->_M_string_length) {
      local_118._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      poVar5 = operator<<(os,(cmMakeSafe *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_a8,(ulong)(local_f8._M_string_length == 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    }
    else {
      psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_d8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar1,pcVar1 + psVar6->_M_string_length);
      pbVar8 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pbVar2->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      local_b0 = (pointer)pbVar2->_M_string_length;
      if (pbVar8 != local_b0) {
        do {
          std::__cxx11::string::_M_assign((string *)&local_d0);
          cmLocalGenerator::MaybeConvertToRelativePath
                    (&local_a0,(cmLocalGenerator *)local_d8,&local_118,&local_d0);
          cmSystemTools::ConvertToOutputPath(&local_78,&local_a0);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          local_78._M_dataplus._M_p = local_f8._M_dataplus._M_p;
          poVar5 = operator<<(os,(cmMakeSafe *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_a8,(ulong)(local_f8._M_string_length == 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          local_a0._M_dataplus._M_p = local_d0._M_dataplus._M_p;
          poVar5 = operator<<(poVar5,(cmMakeSafe *)&local_a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\t","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n","");
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_118,&local_78,local_58,&local_a0,&local_50);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    this_01 = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((symbolic) && (bVar3 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this_01), !bVar3)
       ) {
      std::__ostream_insert<char,std::char_traits<char>>(os,".PHONY : ",9);
      local_118._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      poVar5 = operator<<(os,(cmMakeSafe *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_01->LocalHelp,local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return;
    }
  }
  operator_delete(local_d0._M_dataplus._M_p,
                  CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                           local_d0.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    std::string err("No target for WriteMakeRule! called with comment: ");
    if (comment) {
      err += comment;
    }
    cmSystemTools::Error(err);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::string const& depend : depends) {
      replace = depend;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace));
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}